

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_DeleteSubscriptions
               (UA_Server *server,UA_Session *session,UA_DeleteSubscriptionsRequest *request,
               UA_DeleteSubscriptionsResponse *response)

{
  UA_StatusCode UVar1;
  UA_StatusCode *pUVar2;
  UA_NodeId *dst;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  
  sVar4 = request->subscriptionIdsSize;
  if (sVar4 == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    pUVar2 = (UA_StatusCode *)malloc(sVar4 * 4);
    response->results = pUVar2;
    if (pUVar2 == (UA_StatusCode *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
    }
    else {
      response->resultsSize = sVar4;
      for (uVar3 = 0; uVar3 < sVar4; uVar3 = uVar3 + 1) {
        UVar1 = UA_Session_deleteSubscription(server,session,request->subscriptionIds[uVar3]);
        response->results[uVar3] = UVar1;
        sVar4 = request->subscriptionIdsSize;
      }
      if ((session->serverSubscriptions).lh_first == (UA_Subscription *)0x0) {
        dst = (UA_NodeId *)UA_new(UA_TYPES + 0x10);
        if (dst != (UA_NodeId *)0x0) {
          UA_NodeId_copy(&session->authenticationToken,dst);
          UA_Server_delayedCallback(server,UA_Subscription_answerPublishRequestsNoSubscription,dst);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
Service_DeleteSubscriptions(UA_Server *server, UA_Session *session,
                            const UA_DeleteSubscriptionsRequest *request,
                            UA_DeleteSubscriptionsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteSubscriptionsRequest");

    if(request->subscriptionIdsSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->subscriptionIdsSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->subscriptionIdsSize;

    for(size_t i = 0; i < request->subscriptionIdsSize; ++i) {
        response->results[i] = UA_Session_deleteSubscription(server, session, request->subscriptionIds[i]);
        if(response->results[i] == UA_STATUSCODE_GOOD) {
            UA_LOG_DEBUG_SESSION(server->config.logger, session, "Subscription %u | "
                                "Subscription deleted", request->subscriptionIds[i]);
        } else {
            UA_LOG_DEBUG_SESSION(server->config.logger, session, "Deleting Subscription with Id "
                                 "%u failed with error code 0x%08x", request->subscriptionIds[i],
                                 response->results[i]);
        }
    }

    /* Send dangling publish responses in a delayed job if the last subscription
       was removed */
    if(LIST_FIRST(&session->serverSubscriptions))
        return;
    UA_NodeId *sessionToken = UA_NodeId_new();
    if(!sessionToken)
        return;
    UA_NodeId_copy(&session->authenticationToken, sessionToken);
    UA_Server_delayedCallback(server, (UA_ServerCallback)UA_Subscription_answerPublishRequestsNoSubscription,
                              sessionToken);
}